

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexResult> *
wasm::WATParser::anon_unknown_0::hexfloat
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          string_view in)

{
  bool bVar1;
  LexIntResult *pLVar2;
  OverflowBehavior in_R8D;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view in_00;
  string_view in_01;
  anon_unknown_0 *local_148;
  char *local_140;
  undefined1 local_138 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed_2;
  anon_unknown_0 *local_d0;
  char *local_c8;
  undefined1 local_c0 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed_1;
  anon_unknown_0 *local_88;
  char *local_80;
  undefined1 local_78 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  undefined1 local_30 [8];
  LexCtx ctx;
  string_view in_local;
  
  ctx.lexedSize = in._M_len;
  LexCtx::LexCtx((LexCtx *)local_30,in);
  join_0x00000010_0x00000000_ = sv("0x",2);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_30,join_0x00000010_0x00000000_);
  if (!bVar1) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  sVar3 = LexCtx::next((LexCtx *)local_30);
  local_88 = (anon_unknown_0 *)sVar3._M_len;
  local_80 = sVar3._M_str;
  sVar3._M_str = (char *)0x1;
  sVar3._M_len = (size_t)local_80;
  hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_78,local_88,sVar3,
         in_R8D);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_78);
  if (!bVar1) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                     ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_78);
  LexCtx::take((LexCtx *)local_30,&pLVar2->super_LexResult);
  join_0x00000010_0x00000000_ = sv(".",1);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_30,join_0x00000010_0x00000000_);
  if (bVar1) {
    sVar3 = LexCtx::next((LexCtx *)local_30);
    local_d0 = (anon_unknown_0 *)sVar3._M_len;
    local_c8 = sVar3._M_str;
    in_00._M_str = (char *)0x1;
    in_00._M_len = (size_t)local_c8;
    hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_c0,local_d0,in_00
           ,in_R8D);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_c0);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_c0
                         );
      LexCtx::take((LexCtx *)local_30,&pLVar2->super_LexResult);
    }
  }
  bVar4 = sv("P",1);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar4);
  if (!bVar1) {
    bVar4 = sv("p",1);
    bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar4);
    if (!bVar1) goto LAB_02321448;
  }
  bVar4 = sv("+",1);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar4);
  if (!bVar1) {
    join_0x00000010_0x00000000_ = sv("-",1);
    LexCtx::takePrefix((LexCtx *)local_30,join_0x00000010_0x00000000_);
  }
  sVar3 = LexCtx::next((LexCtx *)local_30);
  local_148 = (anon_unknown_0 *)sVar3._M_len;
  local_140 = sVar3._M_str;
  in_01._M_str = (char *)0x1;
  in_01._M_len = (size_t)local_140;
  num((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_138,local_148,in_01,
      in_R8D);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_138);
  if (!bVar1) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator*
                     ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_138);
  LexCtx::take((LexCtx *)local_30,&pLVar2->super_LexResult);
LAB_02321448:
  LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> hexfloat(std::string_view in) {
  LexCtx ctx(in);
  if (!ctx.takePrefix("0x"sv)) {
    return {};
  }
  if (auto lexed = hexnum(ctx.next(), IgnoreOverflow)) {
    ctx.take(*lexed);
  } else {
    return {};
  }
  // Optional '.' followed by optional hexfrac
  if (ctx.takePrefix("."sv)) {
    if (auto lexed = hexnum(ctx.next(), IgnoreOverflow)) {
      ctx.take(*lexed);
    }
  }
  if (ctx.takePrefix("P"sv) || ctx.takePrefix("p"sv)) {
    // Optional sign
    ctx.takePrefix("+"sv) || ctx.takePrefix("-"sv);
    if (auto lexed = num(ctx.next(), IgnoreOverflow)) {
      ctx.take(*lexed);
    } else {
      // TODO: Add error production for missing exponent.
      return {};
    }
  }
  return ctx.lexed();
}